

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O0

bool dxil_spv::emit_finished_cross_group_sharing(Impl *impl,CallInst *inst)

{
  Id arg;
  Id IVar1;
  Builder *pBVar2;
  Operation *pOVar3;
  Operation *this;
  Operation *call_op;
  Operation *add_op;
  Operation *load_op;
  Id call_id;
  CallInst *inst_local;
  Impl *impl_local;
  
  arg = SPIRVModule::get_helper_call_id(impl->spirv_module,FinishCrossGroupSharing,0);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(pBVar2,0x40);
  pOVar3 = Converter::Impl::allocate(impl,OpLoad,IVar1);
  Operation::add_id(pOVar3,(impl->node_input).private_bda_var_id);
  Converter::Impl::add(impl,pOVar3,false);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(pBVar2,0x40);
  this = Converter::Impl::allocate(impl,OpIAdd,IVar1);
  Operation::add_id(this,pOVar3->id);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUint64Constant
                    (pBVar2,(ulong)((impl->node_input).payload_stride - 4),false);
  Operation::add_id(this,IVar1);
  Converter::Impl::add(impl,this,false);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeBoolType(pBVar2);
  pOVar3 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)inst,IVar1);
  Operation::add_id(pOVar3,arg);
  Operation::add_id(pOVar3,this->id);
  Converter::Impl::add(impl,pOVar3,false);
  return true;
}

Assistant:

bool emit_finished_cross_group_sharing(Converter::Impl &impl, const llvm::CallInst *inst)
{
	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::FinishCrossGroupSharing);

	auto *load_op = impl.allocate(spv::OpLoad, impl.builder().makeUintType(64));
	load_op->add_id(impl.node_input.private_bda_var_id);
	impl.add(load_op);

	auto *add_op = impl.allocate(spv::OpIAdd, impl.builder().makeUintType(64));
	add_op->add_id(load_op->id);
	// Use the last 4 bytes of the node as the u32 cookie.
	// We don't have the node pointer type here, so this is the most convenient approach.
	add_op->add_id(impl.builder().makeUint64Constant(impl.node_input.payload_stride - 4));
	impl.add(add_op);

	auto *call_op = impl.allocate(spv::OpFunctionCall, inst, impl.builder().makeBoolType());
	call_op->add_id(call_id);
	call_op->add_id(add_op->id);
	impl.add(call_op);

	return true;
}